

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.cpp
# Opt level: O0

regex * SudoMaker::ReGlob::Regexp
                  (regex *__return_storage_ptr__,string *glob,config config,bool _is_path)

{
  flag_type local_5c;
  syntax_option_type regex_type;
  undefined1 local_48 [8];
  string regexp_str;
  bool _is_path_local;
  string *glob_local;
  config config_local;
  
  regexp_str.field_2._M_local_buf[0xf] = _is_path;
  RegexpString((string *)local_48,glob,config,_is_path);
  local_5c = std::regex_constants::operator|(0x10,4);
  if (((uint5)config & 1) != 0) {
    local_5c = std::regex_constants::operator|(local_5c,1);
  }
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,local_5c)
  ;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::regex ReGlob::Regexp(const std::string &glob, ReGlob::config config, bool _is_path) {
	auto regexp_str = RegexpString(glob, config, _is_path);

	std::regex_constants::syntax_option_type regex_type = std::regex::ECMAScript | std::regex::optimize;

	if (config.ignore_case) {
		regex_type = regex_type | std::regex::icase;
	}

	return std::regex(regexp_str, regex_type);
}